

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

int32_t ra_advance_until_freeing(roaring_array_t *ra,uint16_t x,int32_t pos)

{
  long lVar1;
  
  for (lVar1 = (long)pos; (lVar1 < ra->size && (ra->keys[lVar1] < x)); lVar1 = lVar1 + 1) {
    container_free(ra->containers[lVar1],ra->typecodes[lVar1]);
  }
  return (int32_t)lVar1;
}

Assistant:

int32_t ra_advance_until_freeing(roaring_array_t *ra, uint16_t x, int32_t pos) {
    while (pos < ra->size && ra->keys[pos] < x) {
        container_free(ra->containers[pos], ra->typecodes[pos]);
        ++pos;
    }
    return pos;
}